

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall TcpSocketTest::Run(TcpSocketTest *this)

{
  Selector *this_00;
  int local_154;
  int local_150;
  uint32_t new_number;
  uint32_t number;
  int res;
  Address client_addr;
  Address server_addr;
  ServerSocket server;
  Socket sock;
  TcpSocketTest *this_local;
  
  this_00 = (Selector *)
            operator_new(0x278,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                         ,0xcb);
  Selector::Selector(this_00,"TcpSelector");
  this->mSelector = this_00;
  JetHead::Socket::Socket((Socket *)&stack0xffffffffffffff70,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)(server_addr.mName + 8),true);
  JetHead::Socket::Address::Address((Address *)(client_addr.mName + 8));
  JetHead::Socket::Address::Address((Address *)&number);
  new_number = JetHead::ServerSocket::bind((Address *)(server_addr.mName + 8));
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xd4,"Bind Failed");
  }
  new_number = JetHead::ServerSocket::listen((int)&server_addr + 0x1c);
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xd9,"Listen Failed");
  }
  new_number = JetHead::Socket::getLocalAddress((Address *)(server_addr.mName + 8));
  JetHead::Socket::Address::setAddress(client_addr.mName + 8);
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xdf,"get local addr failed");
  }
  JetHead::Socket::setSelector
            ((SocketListener *)(server_addr.mName + 8),(Selector *)&this->super_SocketListener);
  new_number = JetHead::Socket::connect((Address *)&stack0xffffffffffffff70);
  local_150 = 1000;
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xea,"connect failed");
  }
  new_number = JetHead::Socket::write(&stack0xffffffffffffff70,(int)&local_150);
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xef,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xffffffffffffff70,(int)&local_154);
  if (local_154 != local_150 + 1) {
    jh_log_print(2,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xf4,"FAILED");
  }
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xf7,"write failed");
  }
  local_150 = local_154 + 1;
  new_number = JetHead::Socket::write(&stack0xffffffffffffff70,(int)&local_150);
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xfe,"write failed");
  }
  new_number = JetHead::Socket::read(&stack0xffffffffffffff70,(int)&local_154);
  if (local_154 != local_150 + 1) {
    jh_log_print(2,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0x103,"FAILED");
  }
  if ((int)new_number < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0x106,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  usleep(100000);
  if (this->mTestState != 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x111,"handleClose not recieved on server");
  }
  if (this->mSelector != (Selector *)0x0) {
    (**(code **)(*(long *)this->mSelector + 0x58))();
  }
  TestCase::TestPassed(&this->super_TestCase);
  JetHead::Socket::Address::~Address((Address *)&number);
  JetHead::Socket::Address::~Address((Address *)(client_addr.mName + 8));
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)(server_addr.mName + 8));
  JetHead::Socket::~Socket((Socket *)&stack0xffffffffffffff70);
  return;
}

Assistant:

void TcpSocketTest::Run()
{	
	LOG_NOTICE( "TCP Test Started" );

	mSelector = jh_new Selector( "TcpSelector" );

	Socket sock;
	ServerSocket server;
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		LOG_WARN_PERROR( "Bind Failed" );

	res = server.listen( 5 );

	if ( res < 0 )
		LOG_WARN_PERROR( "Listen Failed" );
	
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	
	server.setSelector( this, mSelector );
	res = sock.connect( server_addr );

	uint32_t number = 1000;
	uint32_t new_number;
	
	if ( res < 0 )
		LOG_WARN_PERROR( "connect failed" );
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		LOG_WARN( "FAILED" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );

	number = new_number + 1;
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		LOG_WARN( "FAILED" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );
	
	LOG_NOTICE( "Data sent" );
	
	mTestState = 0;
	
	sock.close();
	usleep( 100000 );
	
	if ( mTestState != 1 )
	{
		TestFailed( "handleClose not recieved on server" );
	}
	
	delete mSelector;
	
	TestPassed();
}